

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::FirstLineOf
          (string *__return_storage_ptr__,java *this,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ulong uVar3;
  string *psVar4;
  undefined8 uVar5;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,this,this + (long)&value->_M_dataplus);
  uVar3 = std::__cxx11::string::find((char)__return_storage_ptr__,10);
  if (uVar3 != 0xffffffffffffffff) {
    if (__return_storage_ptr__->_M_string_length < uVar3) {
      uVar5 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase",uVar3);
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar5);
    }
    __return_storage_ptr__->_M_string_length = uVar3;
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar3] = '\0';
  }
  psVar4 = (string *)__return_storage_ptr__->_M_string_length;
  if ((psVar4 != (string *)0x0) &&
     (((__return_storage_ptr__->_M_dataplus)._M_p + -1)[(long)psVar4] == '{')) {
    psVar4 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return psVar4;
}

Assistant:

static string FirstLineOf(const string& value) {
  string result = value;

  string::size_type pos = result.find_first_of('\n');
  if (pos != string::npos) {
    result.erase(pos);
  }

  // If line ends in an opening brace, make it "{ ... }" so it looks nice.
  if (!result.empty() && result[result.size() - 1] == '{') {
    result.append(" ... }");
  }

  return result;
}